

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pcp_event_handler.c
# Opt level: O2

pcp_server_state_e handle_server_set_not_working(pcp_server_t *s)

{
  flow_iterator_data d;
  
  d.event = fev_failed;
  d.s = s;
  pcp_logger(PCP_LOGLVL_WARN,
             "PCP server %s failed to respond. Disabling sending of PCP messages to this server for %d minutes."
             ,s->pcp_server_paddr,0x3c);
  pcp_db_foreach_flow(s->ctx,flow_send_event_iter,&d);
  gettimeofday((timeval *)&s->next_timeout,(__timezone_ptr_t)0x0);
  (s->next_timeout).tv_sec = (s->next_timeout).tv_sec + 0xe10;
  return pss_not_working;
}

Assistant:

static pcp_server_state_e handle_server_set_not_working(pcp_server_t *s) {
    struct flow_iterator_data d = {s, fev_failed};

    PCP_LOG(PCP_LOGLVL_DEBUG, "Entered function %s", __FUNCTION__);
    PCP_LOG(PCP_LOGLVL_WARN,
            "PCP server %s failed to respond. "
            "Disabling sending of PCP messages to this server for %d minutes.",
            s->pcp_server_paddr, PCP_SERVER_DISCOVERY_RETRY_DELAY / 60);

    pcp_db_foreach_flow(s->ctx, flow_send_event_iter, &d);

    gettimeofday(&s->next_timeout, NULL);
    s->next_timeout.tv_sec += PCP_SERVER_DISCOVERY_RETRY_DELAY;

    return pss_not_working;
}